

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.h
# Opt level: O3

void __thiscall cfd::UtxoData::~UtxoData(UtxoData *this)

{
  pointer puVar1;
  pointer pcVar2;
  
  core::Script::~Script(&this->scriptsig_template);
  (this->value_commitment)._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  puVar1 = (this->value_commitment).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->amount_blind_factor)._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
  puVar1 = (this->amount_blind_factor).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->asset_blind_factor)._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
  puVar1 = (this->asset_blind_factor).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&this->confidential_address);
  (this->asset)._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
  puVar1 = (this->asset).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pcVar2 = (this->descriptor)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->descriptor).field_2) {
    operator_delete(pcVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(this->address).format_data_);
  core::Script::~Script(&(this->address).redeem_script_);
  (this->address).script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&(this->address).script_tree_.nodes_);
  core::TapBranch::~TapBranch(&(this->address).script_tree_.super_TapBranch);
  puVar1 = (this->address).schnorr_pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->address).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (this->address).hash_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  pcVar2 = (this->address).address_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->address).address_.field_2) {
    operator_delete(pcVar2);
  }
  core::Script::~Script(&this->redeem_script);
  core::Script::~Script(&this->locking_script);
  (this->txid)._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  puVar1 = (this->txid).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->block_hash)._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00723790;
  puVar1 = (this->block_hash).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
    return;
  }
  return;
}

Assistant:

struct CFD_EXPORT UtxoData {
 public:
  uint64_t block_height = 0;  //!< blick height
  BlockHash block_hash;       //!< block hash
  Txid txid;                  //!< txid
  uint32_t vout = 0;          //!< vout
  Script locking_script;      //!< locking script
  Script redeem_script;       //!< script
  Address address;            //!< address
  std::string descriptor;     //!< output descriptor
  Amount amount;              //!< amount
  //! address type
  AddressType address_type = AddressType::kP2shAddress;
  //! binary data option
  void* binary_data = nullptr;
#ifndef CFD_DISABLE_ELEMENTS
  ConfidentialAssetId asset;  //!< asset
  // elements
  ElementsConfidentialAddress confidential_address;  //!< Confidential address
  BlindFactor asset_blind_factor;                    //!< asset blind factor
  BlindFactor amount_blind_factor;                   //!< blind vactor
  ConfidentialValue value_commitment;                //!< value commitment
#endif                                               // CFD_DISABLE_ELEMENTS
  Script scriptsig_template;                         //!< scriptsig template

 public:
  /**
   * @brief constructor.
   */
  UtxoData();
#ifndef CFD_DISABLE_ELEMENTS
  /**
   * @brief constructor.
   * @param[in] block_height    block_height
   * @param[in] block_hash    block_hash
   * @param[in] txid    txid
   * @param[in] vout    vout
   * @param[in] locking_script    locking_script
   * @param[in] redeem_script    redeem_script
   * @param[in] address    address
   * @param[in] descriptor    descriptor
   * @param[in] amount    amount
   * @param[in] address_type    address_type
   * @param[in] binary_data    binary_data
   * @param[in] asset    asset
   * @param[in] confidential_address    confidential_address
   * @param[in] asset_blind_factor    asset_blind_factor
   * @param[in] amount_blind_factor    amount_blind_factor
   * @param[in] value_commitment    value_commitment
   * @param[in] scriptsig_template    scriptsig_template
   */
  explicit UtxoData(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script, const Script& redeem_script,
      const Address& address, const std::string& descriptor,
      const Amount& amount, AddressType address_type, void* binary_data,
      const ConfidentialAssetId& asset,
      const ElementsConfidentialAddress& confidential_address,
      const BlindFactor& asset_blind_factor,
      const BlindFactor& amount_blind_factor,
      const ConfidentialValue& value_commitment,
      const Script& scriptsig_template);
#else
  /**
   * @brief constructor.
   * @param[in] block_height    block_height
   * @param[in] block_hash    block_hash
   * @param[in] txid    txid
   * @param[in] vout    vout
   * @param[in] locking_script    locking_script
   * @param[in] redeem_script    redeem_script
   * @param[in] address    address
   * @param[in] descriptor    descriptor
   * @param[in] amount    amount
   * @param[in] address_type    address_type
   * @param[in] binary_data    binary_data
   * @param[in] scriptsig_template    scriptsig_template
   */
  explicit UtxoData(
      uint64_t block_height, const BlockHash& block_hash, const Txid& txid,
      uint32_t vout, const Script& locking_script, const Script& redeem_script,
      const Address& address, const std::string& descriptor,
      const Amount& amount, AddressType address_type, void* binary_data,
      const Script& scriptsig_template);
#endif  // CFD_DISABLE_ELEMENTS
  /**
   * @brief copy constructor.
   * @param[in] object    object
   */
  UtxoData(const UtxoData& object);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  UtxoData& operator=(const UtxoData& object) &;
}